

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.h
# Opt level: O2

const_iterator __thiscall
frozen::set<unsigned_long,_3UL,_std::less<unsigned_long>_>::find<int>
          (set<unsigned_long,_3UL,_std::less<unsigned_long>_> *this,int *key)

{
  set<unsigned_long,_3UL,_std::less<unsigned_long>_> *psVar1;
  
  psVar1 = (set<unsigned_long,_3UL,_std::less<unsigned_long>_> *)lower_bound<int>(this,key);
  if ((psVar1 == this + 1) || ((ulong)(long)*key < (psVar1->keys_).data_[0])) {
    psVar1 = this + 1;
  }
  return (const_iterator)psVar1;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    const_iterator where = lower_bound(key);
    if ((where != end()) && !value_comp()(key, *where))
      return where;
    else
      return end();
  }